

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> embree::SceneGraph::load(FileName *filename,bool singleObject)

{
  __type _Var1;
  byte bVar2;
  byte bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  byte in_DL;
  Node *in_RDI;
  AffineSpace3fa *in_stack_fffffffffffffab0;
  undefined7 in_stack_fffffffffffffab8;
  undefined1 in_stack_fffffffffffffabf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac8;
  undefined7 in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffad7;
  undefined7 in_stack_fffffffffffffae8;
  undefined1 in_stack_fffffffffffffaef;
  string *in_stack_fffffffffffffaf8;
  string *s;
  string local_4b0 [40];
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  allocator local_441;
  string local_440 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  string local_400 [38];
  undefined1 in_stack_fffffffffffffc26;
  undefined1 in_stack_fffffffffffffc27;
  FileName *in_stack_fffffffffffffc28;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  allocator local_391;
  string local_390 [32];
  string local_370 [32];
  string local_350 [39];
  allocator local_329;
  string local_328 [32];
  string local_308;
  string local_2e8 [16];
  FileName *in_stack_fffffffffffffd28;
  allocator local_2c1;
  string local_2c0 [48];
  string local_290 [32];
  string local_270 [39];
  byte local_249;
  undefined1 *local_238;
  undefined8 *local_230;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined4 local_1bc;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined8 *local_1b0;
  undefined4 local_1a4;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined8 *local_198;
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 local_184;
  undefined8 *local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined4 local_168;
  undefined4 local_164;
  undefined4 local_160;
  undefined4 local_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 local_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined1 *local_b0;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined8 *local_98;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_249 = in_DL & 1;
  FileName::ext_abi_cxx11_
            ((FileName *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
  toLowerCase(in_stack_fffffffffffffaf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"obj",&local_2c1);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                          in_stack_fffffffffffffac8);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string(local_290);
  if (_Var1) {
    loadOBJ(in_stack_fffffffffffffc28,(bool)in_stack_fffffffffffffc27,
            (bool)in_stack_fffffffffffffc26);
  }
  else {
    s = &local_308;
    FileName::ext_abi_cxx11_
              ((FileName *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
    toLowerCase(s);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_328,"ply",&local_329);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                            in_stack_fffffffffffffac8);
    std::__cxx11::string::~string(local_328);
    std::allocator<char>::~allocator((allocator<char> *)&local_329);
    std::__cxx11::string::~string(local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    if ((bVar2 & 1) == 0) {
      FileName::ext_abi_cxx11_((FileName *)CONCAT17(bVar2,in_stack_fffffffffffffae8));
      toLowerCase(s);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_390,"xml",&local_391);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                              in_stack_fffffffffffffac8);
      std::__cxx11::string::~string(local_390);
      std::allocator<char>::~allocator((allocator<char> *)&local_391);
      std::__cxx11::string::~string(local_350);
      std::__cxx11::string::~string(local_370);
      if ((bVar3 & 1) == 0) {
        pbVar4 = &local_420;
        FileName::ext_abi_cxx11_((FileName *)CONCAT17(bVar2,in_stack_fffffffffffffae8));
        toLowerCase(s);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_440,"scn",&local_441);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(bVar3,in_stack_fffffffffffffad0),pbVar4);
        std::__cxx11::string::~string(local_440);
        std::allocator<char>::~allocator((allocator<char> *)&local_441);
        std::__cxx11::string::~string(local_400);
        std::__cxx11::string::~string((string *)&local_420);
        if ((bVar3 & 1) == 0) {
          pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x10);
          FileName::ext_abi_cxx11_((FileName *)CONCAT17(bVar2,in_stack_fffffffffffffae8));
          std::operator+((char *)CONCAT17(bVar3,in_stack_fffffffffffffab8),pbVar4);
          std::runtime_error::runtime_error((runtime_error *)pbVar4,local_4b0);
          __cxa_throw(pbVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_230 = &local_488;
        local_100 = &one;
        local_1c8 = &zero;
        local_1d0 = &zero;
        local_1b4 = 0x3f800000;
        local_1b8 = 0;
        local_1bc = 0;
        local_114 = 0;
        local_118 = 0;
        local_11c = 0;
        local_120 = 0x3f800000;
        local_138 = 0x3f800000;
        uStack_130 = 0;
        local_488 = 0x3f800000;
        uStack_480 = 0;
        local_198 = &local_478;
        local_1d8 = &zero;
        local_108 = &one;
        local_1e0 = &zero;
        local_19c = 0;
        local_1a0 = 0x3f800000;
        local_1a4 = 0;
        local_13c = 0;
        local_140 = 0;
        local_144 = 0x3f800000;
        local_148 = 0;
        local_158 = 0x3f80000000000000;
        uStack_150 = 0;
        local_478 = 0x3f80000000000000;
        uStack_470 = 0;
        local_180 = &local_468;
        local_1e8 = &zero;
        local_1f0 = &zero;
        local_110 = &one;
        local_184 = 0;
        local_188 = 0;
        local_18c = 0x3f800000;
        local_15c = 0;
        local_160 = 0x3f800000;
        local_164 = 0;
        local_168 = 0;
        local_178 = 0;
        uStack_170 = 0x3f800000;
        local_468 = 0;
        uStack_460 = 0x3f800000;
        local_228 = &local_458;
        local_208 = 0;
        uStack_200 = 0;
        local_458 = 0;
        uStack_450 = 0;
        local_1f8 = local_230;
        local_1b0 = local_230;
        loadCorona((FileName *)CONCAT17(bVar3,in_stack_fffffffffffffab8),in_stack_fffffffffffffab0);
      }
      else {
        local_238 = &stack0xfffffffffffffc28;
        local_8 = &one;
        local_c8 = &zero;
        local_d0 = &zero;
        local_b4 = 0x3f800000;
        local_b8 = 0;
        local_bc = 0;
        local_1c = 0;
        local_20 = 0;
        local_24 = 0;
        local_28 = 0x3f800000;
        local_38 = 0x3f800000;
        uStack_30 = 0;
        local_98 = &local_3c8;
        local_d8 = &zero;
        local_10 = &one;
        local_e0 = &zero;
        local_9c = 0;
        local_a0 = 0x3f800000;
        local_a4 = 0;
        local_3c = 0;
        local_40 = 0;
        local_44 = 0x3f800000;
        local_48 = 0;
        local_58 = 0x3f80000000000000;
        uStack_50 = 0;
        local_3c8 = 0x3f80000000000000;
        uStack_3c0 = 0;
        local_80 = &local_3b8;
        local_e8 = &zero;
        local_f0 = &zero;
        local_18 = &one;
        local_84 = 0;
        local_88 = 0;
        local_8c = 0x3f800000;
        local_5c = 0;
        local_60 = 0x3f800000;
        local_64 = 0;
        local_68 = 0;
        local_78 = 0;
        uStack_70 = 0x3f800000;
        local_3b8 = 0;
        uStack_3b0 = 0x3f800000;
        local_220 = &local_3a8;
        local_218 = 0;
        uStack_210 = 0;
        local_3a8 = 0;
        uStack_3a0 = 0;
        local_f8 = local_238;
        local_b0 = local_238;
        loadXML((FileName *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8),
                in_stack_fffffffffffffab0);
      }
    }
    else {
      loadPLY(in_stack_fffffffffffffd28);
    }
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::load(const FileName& filename, const bool singleObject)
  {
    if      (toLowerCase(filename.ext()) == std::string("obj" )) return loadOBJ(filename, false, singleObject);
    else if (toLowerCase(filename.ext()) == std::string("ply" )) return loadPLY(filename);
    else if (toLowerCase(filename.ext()) == std::string("xml" )) return loadXML(filename);
    else if (toLowerCase(filename.ext()) == std::string("scn" )) return loadCorona(filename);
    else throw std::runtime_error("unknown scene format: " + filename.ext());
  }